

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CreateSourceFramebuffer<1u>(CopyTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  Functions *gl;
  CopyTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14c9);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14cc);
  pcVar1 = *(code **)(lVar6 + 0x698);
  GVar4 = TextureTarget<1u>(this);
  (*pcVar1)(0x8d40,0x8ce0,GVar4,this->m_to_src,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glFramebufferTexture1D call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14cf);
  iVar2 = (**(code **)(lVar6 + 0x170))(0x8d40);
  if (iVar2 != 0x8cd5) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  (**(code **)(lVar6 + 0x1a00))(0,0,4,1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14d7);
  return;
}

Assistant:

void CopyTest::CreateSourceFramebuffer<1>()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare framebuffer. */
	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.framebufferTexture1D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, TextureTarget<1>(), m_to_src, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_texture_width, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}